

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_ActivateThingSpecial(AActor *thing,AActor *trigger,bool death)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AActor *activator;
  
  uVar2 = thing->activationtype;
  if ((uVar2 & 2) != 0) {
    (thing->target).field_0.p = trigger;
  }
  if ((uVar2 & 4) != 0) {
    (trigger->target).field_0.p = thing;
  }
  if (death) {
    iVar3 = thing->special;
    if (iVar3 == 0) {
      return false;
    }
    uVar2 = thing->activationtype;
    activator = thing;
    if ((level.flags._1_1_ >> 3 & -1 < (char)uVar2) != 0) goto LAB_00414715;
  }
  else {
    uVar2 = thing->activationtype;
    if ((uVar2 & 0x700) == 0) {
LAB_004146a1:
      bVar1 = false;
    }
    else {
      if ((uVar2 & 0x700) == 0x400) {
        uVar2 = uVar2 | 0x100;
        thing->activationtype = uVar2;
      }
      if ((uVar2 >> 8 & 1) == 0) {
        if ((uVar2 >> 9 & 1) == 0) goto LAB_004146a1;
        thing->activationtype = uVar2 >> 2 & 0x100 | uVar2 & 0xfffffcff;
        AActor::CallDeactivate(thing,trigger);
      }
      else {
        thing->activationtype = uVar2 >> 1 & 0x200 | uVar2 & 0xfffffeff;
        AActor::CallActivate(thing,trigger);
      }
      bVar1 = true;
    }
    iVar3 = thing->special;
    if (iVar3 == 0) {
      return bVar1;
    }
    uVar2 = thing->activationtype;
  }
  activator = trigger;
  if ((uVar2 & 1) != 0) {
    activator = thing;
  }
LAB_00414715:
  iVar3 = P_ExecuteSpecial(iVar3,(line_t *)0x0,activator,false,thing->args[0],thing->args[1],
                           thing->args[2],thing->args[3],thing->args[4]);
  if ((death) || ((iVar3 != 0 && ((thing->activationtype & 0x20U) != 0)))) {
    thing->special = 0;
  }
  return iVar3 != 0;
}

Assistant:

bool P_ActivateThingSpecial(AActor * thing, AActor * trigger, bool death)
{
	bool res = false;

	// Target switching mechanism
	if (thing->activationtype & THINGSPEC_ThingTargets)		thing->target = trigger;
	if (thing->activationtype & THINGSPEC_TriggerTargets)	trigger->target = thing;

	// State change mechanism. The thing needs to be not dead and to have at least one of the relevant flags
	if (!death && (thing->activationtype & (THINGSPEC_Activate | THINGSPEC_Deactivate | THINGSPEC_Switch)))
	{
		// If a switchable thing does not know whether it should be activated
		// or deactivated, the default is to activate it.
		if ((thing->activationtype & THINGSPEC_Switch)
			&& !(thing->activationtype & (THINGSPEC_Activate | THINGSPEC_Deactivate)))
		{
			thing->activationtype |= THINGSPEC_Activate;
		}
		// Can it be activated?
		if (thing->activationtype & THINGSPEC_Activate)
		{
			thing->activationtype &= ~THINGSPEC_Activate; // Clear flag
			if (thing->activationtype & THINGSPEC_Switch) // Set other flag if switching
				thing->activationtype |= THINGSPEC_Deactivate;
			thing->CallActivate(trigger);
			res = true;
		}
		// If not, can it be deactivated?
		else if (thing->activationtype & THINGSPEC_Deactivate)
		{
			thing->activationtype &= ~THINGSPEC_Deactivate; // Clear flag
			if (thing->activationtype & THINGSPEC_Switch)	// Set other flag if switching
				thing->activationtype |= THINGSPEC_Activate;
			thing->CallDeactivate(trigger);
			res = true;
		}
	}

	// Run the special, if any
	if (thing->special)
	{
		res = !!P_ExecuteSpecial(thing->special, NULL,
			// TriggerActs overrides the level flag, which only concerns thing activated by death
			(((death && level.flags & LEVEL_ACTOWNSPECIAL && !(thing->activationtype & THINGSPEC_TriggerActs))
			|| (thing->activationtype & THINGSPEC_ThingActs)) // Who triggers?
			? thing : trigger),
			false, thing->args[0], thing->args[1], thing->args[2], thing->args[3], thing->args[4]);

		// Clears the special if it was run on thing's death or if flag is set.
		if (death || (thing->activationtype & THINGSPEC_ClearSpecial && res)) thing->special = 0;
	}

	// Returns the result
	return res;
}